

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandFunEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  Gia_Man_t *pNew;
  char *pcVar6;
  char *pcVar7;
  uint local_cc;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  ulong local_a8;
  char Buffer [100];
  
  local_b4 = 0;
  Extra_UtilGetoptReset();
  local_c4 = 0x20;
  local_bc = 4;
  local_a8 = 4;
  local_b8 = 0;
  bVar2 = false;
  local_cc = 0;
  local_b0 = 0;
  bVar3 = false;
  local_c0 = 0;
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"SIMtrldmpvh");
    iVar1 = globalUtilOptind;
    switch(iVar4) {
    case 100:
      local_cc = local_cc ^ 1;
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_0023a57e_caseD_65:
      pcVar6 = "Unknown switch.\n";
      iVar1 = -2;
LAB_0023a695:
      Abc_Print(iVar1,pcVar6);
    case 0x68:
      goto switchD_0023a57e_caseD_68;
    case 0x6c:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x6d:
      local_b0 = local_b0 ^ 1;
      break;
    case 0x70:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x72:
      local_b8 = local_b8 ^ 1;
      break;
    case 0x74:
      local_b4 = local_b4 ^ 1;
      break;
    case 0x76:
      local_c0 = local_c0 ^ 1;
      break;
    default:
      if (iVar4 != 0x49) {
        if (iVar4 == 0x4d) {
          if (globalUtilOptind < argc) {
            local_c4 = atoi(argv[globalUtilOptind]);
            uVar5 = local_c4;
            goto joined_r0x0023a610;
          }
          pcVar6 = "Command line switch \"-M\" should be followed by an integer.\n";
        }
        else if (iVar4 == 0x53) {
          if (globalUtilOptind < argc) {
            local_bc = atoi(argv[globalUtilOptind]);
            uVar5 = local_bc;
            goto joined_r0x0023a610;
          }
          pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
        }
        else {
          if (iVar4 != -1) goto switchD_0023a57e_caseD_65;
          uVar5 = (uint)local_a8;
          if (!bVar2 && local_cc == 0) {
            if (uVar5 - 7 < 0xfffffffb) {
              pcVar6 = "The number of inputs should be 2 <= I <= 6.\n";
            }
            else {
              if ((local_bc < 7) && (uVar5 <= local_bc)) {
                Dau_FunctionEnum(local_bc,uVar5,local_c4,local_b4,local_b8,local_c0);
                return 0;
              }
              pcVar6 = "The intermediate support size should be I <= S <= 6.\n";
            }
            bVar2 = false;
            Abc_Print(-1,pcVar6);
            local_cc = 0;
            goto switchD_0023a57e_caseD_68;
          }
          if (0xfffffffc < uVar5 - 6) {
            sprintf(Buffer,"Lflib%d.txt",local_a8 & 0xffffffff);
            pcVar6 = (char *)0x0;
            if (bVar3) {
              pcVar6 = Buffer;
            }
            Dtt_EnumerateLf(uVar5,local_c4,local_cc,local_b0,local_c0,pcVar6);
            if (!bVar3) {
              return 0;
            }
            pNew = Dau_ConstructAigFromFile(Buffer);
            Abc_FrameUpdateGia(pAbc,pNew);
            Gia_DumpAiger(pNew,"Lflib",uVar5,1);
            return 0;
          }
          pcVar6 = "The number of inputs should be 3 <= I <= 5.\n";
        }
LAB_0023a693:
        iVar1 = -1;
        goto LAB_0023a695;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0023a693;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_a8 = CONCAT44(extraout_var,uVar5);
joined_r0x0023a610:
      globalUtilOptind = iVar1 + 1;
      if ((int)uVar5 < 0) {
switchD_0023a57e_caseD_68:
        Abc_Print(-2,"usage: funenum [-SIM num] [-trldmvph]\n");
        Abc_Print(-2,"\t         enumerates minimum 2-input-gate implementations\n");
        Abc_Print(-2,"\t-S num : the maximum intermediate support size [default = %d]\n",
                  (ulong)local_bc);
        Abc_Print(-2,"\t-I num : the number of inputs of Boolean functions [default = %d]\n",
                  local_a8);
        Abc_Print(-2,"\t-M num : the maximum number of 2-input gates [default = %d]\n",
                  (ulong)local_c4);
        pcVar7 = "yes";
        pcVar6 = "yes";
        if (local_b4 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-t     : toggle adding combination of two gates [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_b8 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-r     : toggle reducing the last level [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (!bVar2) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-l     : toggle generating L(f) rather than C(f) [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_cc == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle generating D(f) rather than C(f) [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_b0 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-m     : toggle generating multiplicity statistics [default = %s]\n",pcVar6)
        ;
        pcVar6 = "yes";
        if (local_c0 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
        if (!bVar3) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle dumping result library (formula and AIG) [default = %s]\n",
                  pcVar7);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandFunEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName );
    extern void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose );
    extern Gia_Man_t * Dau_ConstructAigFromFile( char * pFileName );
    int c, nInputs = 4, nVars = 4, nNodeMax = 32, fUseTwo = 0, fReduce = 0, fSimple = 0, fDelay = 0, fMulti = 0, fDump = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SIMtrldmpvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nInputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInputs < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeMax < 0 )
                goto usage;
            break;
        case 't':
            fUseTwo ^= 1;
            break;
        case 'r':
            fReduce ^= 1;
            break;
        case 'l':
            fSimple ^= 1;
            break;
        case 'd':
            fDelay ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'p':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( fSimple || fDelay )
    {
        char Buffer[100];
        if ( nVars < 3 || nVars > 5 )
        {
            Abc_Print( -1, "The number of inputs should be 3 <= I <= 5.\n" );
            goto usage;
        }
        sprintf( Buffer, "Lflib%d.txt", nVars );
        Dtt_EnumerateLf( nVars, nNodeMax, fDelay, fMulti, fVerbose, fDump?Buffer:NULL );
        if ( fDump )
        {
            Gia_Man_t * pTemp;
            pTemp = Dau_ConstructAigFromFile( Buffer );
            Abc_FrameUpdateGia( pAbc, pTemp );
            Gia_DumpAiger( pTemp, "Lflib", nVars, 1 );
        }
    }
    else
    {
        if ( nVars < 2 || nVars > 6 )
        {
            Abc_Print( -1, "The number of inputs should be 2 <= I <= 6.\n" );
            goto usage;
        }
        if ( nInputs < nVars || nInputs > 6 )
        {
            Abc_Print( -1, "The intermediate support size should be I <= S <= 6.\n" );
            goto usage;
        }
        Dau_FunctionEnum( nInputs, nVars, nNodeMax, fUseTwo, fReduce, fVerbose );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: funenum [-SIM num] [-trldmvph]\n" );
    Abc_Print( -2, "\t         enumerates minimum 2-input-gate implementations\n" );
    Abc_Print( -2, "\t-S num : the maximum intermediate support size [default = %d]\n",     nInputs );
    Abc_Print( -2, "\t-I num : the number of inputs of Boolean functions [default = %d]\n", nVars );
    Abc_Print( -2, "\t-M num : the maximum number of 2-input gates [default = %d]\n",       nNodeMax );
    Abc_Print( -2, "\t-t     : toggle adding combination of two gates [default = %s]\n",    fUseTwo?  "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle reducing the last level [default = %s]\n",            fReduce?  "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle generating L(f) rather than C(f) [default = %s]\n",   fSimple?  "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle generating D(f) rather than C(f) [default = %s]\n",   fDelay?   "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle generating multiplicity statistics [default = %s]\n", fMulti?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle dumping result library (formula and AIG) [default = %s]\n",fDump?"yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}